

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O3

int __thiscall CDesign::Initialize(CDesign *this,char *pName)

{
  undefined1 *__filename;
  undefined1 *__filename_00;
  Branch *pBVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint iLayer;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  FILE *pFVar14;
  char *pcVar15;
  size_t sVar16;
  char *pcVar17;
  CLayer *this_00;
  CNet *pCVar18;
  CPin *pCVar19;
  ulong uVar20;
  CWire *pCVar21;
  CPin *pCVar22;
  CLayer *pCVar23;
  CBoundary *this_01;
  int iVar24;
  int iVar25;
  int *piVar26;
  int j;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  int iZ;
  int iVar30;
  ulong uVar31;
  long lVar32;
  Branch *pBVar33;
  Tree TVar34;
  FILE *local_6a0;
  int local_68c;
  vector<CPin_*,_std::allocator<CPin_*>_> PinList;
  CPin *pPin;
  int local_654;
  Branch *local_650;
  undefined1 *local_648;
  long local_640;
  char cLine [512];
  char cNetName [512];
  char cName [512];
  
  ReadParam(this,pName);
  if (CObject::m_pLog != (FILE *)0x0) {
    fclose((FILE *)CObject::m_pLog);
    CObject::m_pLog = (FILE *)0x0;
  }
  __filename = &this->field_0x234;
  sprintf(cName,"%s.log",__filename);
  CObject::m_pLog = (FILE *)fopen(cName,"wt");
  CObject::m_pDesign = this;
  CObject::Display(0,"input file [%s]\n",__filename);
  __filename_00 = &this->field_0x434;
  CObject::Display(0,"tree file [%s]\n",__filename_00);
  pFVar14 = fopen(__filename,"rt");
  local_6a0 = fopen(__filename_00,"rt");
  local_648 = __filename;
  if (local_6a0 == (FILE *)0x0) {
    CObject::Display(0,"tree file will be written as ");
    if (*__filename_00 == '\0') {
      sprintf(__filename_00,"%s.stt",__filename);
    }
    CObject::Display(5,"%s",__filename_00);
    local_6a0 = fopen(__filename_00,"wt");
    readLUT();
    CObject::Display(0,"building steiner tree by *pure flute\n");
  }
  else {
    this->IsLUTup = 1;
  }
  pcVar15 = fgets(cLine,0x200,pFVar14);
  if (pcVar15 != (char *)0x0) {
LAB_00105d4a:
    if ((cLine[0] == '#') || (sVar16 = strlen(cLine), sVar16 < 2)) goto LAB_00106032;
    pcVar15 = strtok(cLine," \t\n");
    iVar3 = strcasecmp(pcVar15,"grid");
    if (iVar3 == 0) {
      pcVar15 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar15);
      this->m_iSizeX = iVar3;
      pcVar15 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar15);
      this->m_iSizeY = iVar3;
      pcVar15 = strtok((char *)0x0," \t\n");
      if (pcVar15 == (char *)0x0) {
        iVar3 = 2;
      }
      else {
        iVar3 = atoi(pcVar15);
        if (iVar3 < 3) {
          iVar3 = 2;
        }
      }
      this->m_iSizeZ = iVar3;
      CBBox::Initialize(&this->super_CBBox,0,0,0,this->m_iSizeX,this->m_iSizeY,iVar3);
      CreateLayer(this);
      goto LAB_00106032;
    }
    iVar3 = strcasecmp(pcVar15,"vertical");
    if ((iVar3 == 0) && (pcVar17 = strtok((char *)0x0," \t\n"), pcVar17 != (char *)0x0)) {
      pcVar15 = strtok((char *)0x0," \t\n");
      if (pcVar15 != (char *)0x0) {
        iVar3 = 1;
        do {
          iVar13 = atoi(pcVar15);
          if (iVar13 == 0) {
            iVar3 = iVar3 + 1;
          }
          else {
            do {
              iVar6 = iVar3;
              pCVar23 = GetLayer(this,iVar6);
              iVar3 = iVar6 + 1;
            } while ((pCVar23->super_CObject).m_Key != 0);
            pCVar23 = GetLayer(this,iVar6);
            CLayer::Configure(pCVar23,iVar6,iVar13,10,0,0,0,this);
          }
          pcVar15 = strtok((char *)0x0," \t\n");
        } while (pcVar15 != (char *)0x0);
      }
      goto LAB_00106032;
    }
    iVar3 = strcasecmp(pcVar15,"horizontal");
    if ((iVar3 == 0) && (pcVar17 = strtok((char *)0x0," \t\n"), pcVar17 != (char *)0x0)) {
      pcVar15 = strtok((char *)0x0," \t\n");
      if (pcVar15 != (char *)0x0) {
        iVar3 = 1;
        do {
          iVar13 = atoi(pcVar15);
          if (iVar13 == 0) {
            iVar3 = iVar3 + 1;
          }
          else {
            do {
              iVar6 = iVar3;
              pCVar23 = GetLayer(this,iVar6);
              iVar3 = iVar6 + 1;
            } while ((pCVar23->super_CObject).m_Key != 0);
            pCVar23 = GetLayer(this,iVar6);
            CLayer::Configure(pCVar23,iVar6,iVar13,5,0,0,0,this);
          }
          pcVar15 = strtok((char *)0x0," \t\n");
        } while (pcVar15 != (char *)0x0);
      }
      goto LAB_00106032;
    }
    iVar3 = strcasecmp(pcVar15,"minimum");
    if (iVar3 == 0) {
      pcVar15 = strtok((char *)0x0," \t\n");
      iVar3 = strcasecmp(pcVar15,"width");
      if (iVar3 == 0) {
        pcVar15 = strtok((char *)0x0," \t\n");
        if (pcVar15 != (char *)0x0) {
          iVar3 = 1;
          do {
            pCVar23 = GetLayer(this,iVar3);
            iVar13 = atoi(pcVar15);
            CLayer::Configure(pCVar23,-1,-1,-1,iVar13,-1,-1,this);
            pcVar15 = strtok((char *)0x0," \t\n");
            iVar3 = iVar3 + 1;
          } while (pcVar15 != (char *)0x0);
        }
      }
      else {
        iVar3 = strcasecmp(pcVar15,"spacing");
        if ((iVar3 == 0) && (pcVar15 = strtok((char *)0x0," \t\n"), pcVar15 != (char *)0x0)) {
          iVar3 = 1;
          do {
            pCVar23 = GetLayer(this,iVar3);
            iVar13 = atoi(pcVar15);
            CLayer::Configure(pCVar23,-1,-1,-1,-1,iVar13,-1,this);
            pcVar15 = strtok((char *)0x0," \t\n");
            iVar3 = iVar3 + 1;
          } while (pcVar15 != (char *)0x0);
        }
      }
      goto LAB_00106032;
    }
    iVar3 = strcasecmp(pcVar15,"via");
    if (iVar3 == 0) {
      pcVar15 = strtok((char *)0x0," \t\n");
      iVar3 = strcasecmp(pcVar15,"spacing");
      if ((iVar3 == 0) && (pcVar15 = strtok((char *)0x0," \t\n"), pcVar15 != (char *)0x0)) {
        iVar3 = 1;
        do {
          pCVar23 = GetLayer(this,iVar3);
          iVar13 = atoi(pcVar15);
          CLayer::Configure(pCVar23,-1,-1,-1,-1,-1,iVar13,this);
          pcVar15 = strtok((char *)0x0," \t\n");
          iVar3 = iVar3 + 1;
        } while (pcVar15 != (char *)0x0);
      }
      goto LAB_00106032;
    }
    iVar3 = strcasecmp(pcVar15,"num");
    if (iVar3 != 0) {
      iVar3 = atoi(pcVar15);
      this->m_iLowX = iVar3;
      pcVar15 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar15);
      this->m_iLowY = iVar3;
      pcVar15 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar15);
      this->m_iGridX = iVar3;
      pcVar15 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar15);
      this->m_iGridY = iVar3;
      goto LAB_00106032;
    }
    pcVar15 = strtok((char *)0x0," \t\n");
    iVar3 = strcasecmp(pcVar15,"net");
    if (iVar3 != 0) goto LAB_00106032;
    pcVar15 = strtok((char *)0x0," \t\n");
    iVar3 = atoi(pcVar15);
    CreateNet(this,iVar3);
    iVar13 = (int)(this->super_CBBox).m_cMaxZ;
    iVar7 = (int)(this->super_CBBox).m_cMinZ;
    iVar6 = iVar13 - iVar7;
    iVar3 = 0;
    if (iVar6 != 0 && iVar7 <= iVar13) {
      do {
        iVar13 = iVar3 + 1;
        pCVar23 = GetLayer(this,iVar13);
        if ((pCVar23->super_CObject).m_Key == 0) {
          if (iVar3 == 0) {
            iVar3 = 10;
          }
          else {
            this_00 = GetLayer(this,iVar3);
            iVar3 = CLayer::GetDirection(this_00);
            iVar3 = (uint)(iVar3 != 10) * 5 + 5;
          }
          CLayer::Configure(pCVar23,iVar13,0,iVar3,0,0,0,this);
        }
        (*(pCVar23->super_CObject)._vptr_CObject[3])(pCVar23);
        iVar3 = this->m_iMaxCapacity;
        iVar6 = CLayer::GetCapacity(pCVar23,0x40);
        if (iVar6 < iVar3) {
          iVar3 = this->m_iMaxCapacity;
        }
        else {
          iVar3 = CLayer::GetCapacity(pCVar23,0x40);
        }
        this->m_iMaxCapacity = iVar3;
        iVar6 = (int)(this->super_CBBox).m_cMaxZ - (int)(this->super_CBBox).m_cMinZ;
        iVar3 = iVar13;
      } while (iVar13 < iVar6);
    }
    this->m_iHighestRoutableLayer = iVar6;
    this->m_iLowestRoutableLayer = 1;
  }
LAB_00106336:
  uVar4 = GetCapacity(this,0x1000);
  local_68c = 0;
  CObject::Display(0,"total available capacity: %d\n",(ulong)uVar4);
  iVar3 = GetMemory();
  CObject::Display(0,"reading nets started (%.1f MB)\n",SUB84((double)iVar3 * 0.0009765625,0));
  if (0 < this->m_iNumNet) {
    local_68c = 0;
    iVar3 = 0;
LAB_0010639f:
    do {
      local_654 = iVar3;
      pcVar15 = fgets(cLine,0x200,pFVar14);
      if (pcVar15 != (char *)0x0) {
        iVar3 = local_654;
        if ((cLine[0] == '#') || (sVar16 = strlen(cLine), iVar3 = local_654, sVar16 < 2))
        goto LAB_0010639f;
      }
      pcVar15 = strtok(cLine," \t\n");
      sprintf(cNetName,pcVar15);
      pcVar15 = strtok((char *)0x0," \t\n");
      uVar4 = atoi(pcVar15);
      pcVar15 = strtok((char *)0x0," \t\n");
      uVar5 = atoi(pcVar15);
      strtok((char *)0x0," \t\n");
      pCVar18 = (CNet *)operator_new(0x68);
      CNet::CNet(pCVar18);
      local_640 = (long)local_68c;
      this->m_ppNet[local_640] = pCVar18;
      pCVar18 = this->m_ppNet[local_640];
      if (pCVar18 == (CNet *)0x0) {
        __assert_fail("m_ppNet[iNetIndex]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x30c,"virtual int CDesign::Initialize(char *)");
      }
      (*(pCVar18->super_CObject)._vptr_CObject[3])(pCVar18,(ulong)uVar4,this);
      if ((int)uVar5 < 0x3e9) {
        PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if (0 < (int)uVar5) {
          uVar4 = 0;
LAB_00106528:
          do {
            pcVar15 = fgets(cLine,0x200,pFVar14);
            if (pcVar15 != (char *)0x0) {
              if ((cLine[0] == '#') || (sVar16 = strlen(cLine), sVar16 < 2)) goto LAB_00106528;
            }
            pcVar15 = strtok(cLine," \t\n");
            iVar3 = atoi(pcVar15);
            pcVar15 = strtok((char *)0x0," \t\n");
            iVar13 = atoi(pcVar15);
            uVar28 = (long)(iVar3 - this->m_iLowX) / (long)this->m_iGridX;
            uVar20 = (long)(iVar13 - this->m_iLowY) / (long)this->m_iGridY;
            pcVar15 = strtok((char *)0x0," \t\n");
            if (pcVar15 == (char *)0x0) {
              uVar8 = 1;
            }
            else {
              uVar8 = atoi(pcVar15);
            }
            pPin = (CPin *)0x0;
            if ((long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
LAB_00106635:
              pCVar19 = (CPin *)operator_new(0x28);
              CPin::CPin(pCVar19);
              pPin = pCVar19;
              (*(pCVar19->super_CPoint).super_CObject._vptr_CObject[4])
                        (pCVar19,(ulong)((long)PinList.
                                               super__Vector_base<CPin_*,_std::allocator<CPin_*>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)PinList.
                                              super__Vector_base<CPin_*,_std::allocator<CPin_*>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3,
                         uVar28 & 0xffffffff,uVar20 & 0xffffffff,(ulong)uVar8,pCVar18);
              if (PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<CPin*,std::allocator<CPin*>>::_M_realloc_insert<CPin*const&>
                          ((vector<CPin*,std::allocator<CPin*>> *)&PinList,
                           (iterator)
                           PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                           super__Vector_impl_data._M_finish,&pPin);
              }
              else {
                *PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                 super__Vector_impl_data._M_finish = pPin;
                PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              uVar31 = 1;
              do {
                pCVar19 = PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar31 - 1];
                bVar2 = true;
                if (((int)uVar28 == (int)(pCVar19->super_CPoint).m_iX) &&
                   ((int)uVar20 == (int)(pCVar19->super_CPoint).m_iY)) {
                  bVar2 = false;
                  pPin = pCVar19;
                }
              } while ((uVar31 < (ulong)((long)PinList.
                                               super__Vector_base<CPin_*,_std::allocator<CPin_*>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)PinList.
                                               super__Vector_base<CPin_*,_std::allocator<CPin_*>_>.
                                               _M_impl.super__Vector_impl_data._M_start >> 3)) &&
                      (uVar31 = uVar31 + 1, bVar2));
              if (bVar2) goto LAB_00106635;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 != uVar5);
        }
      }
      else {
        uVar4 = 0;
        CObject::Display(3,"net (%s) with too many pins (%d) will be ignored\n",cNetName,
                         (ulong)uVar5);
LAB_001064ad:
        do {
          pcVar15 = fgets(cLine,0x200,pFVar14);
          if (pcVar15 != (char *)0x0) {
            if ((cLine[0] == '#') || (sVar16 = strlen(cLine), sVar16 < 2)) goto LAB_001064ad;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar5);
        PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
      }
      CNet::AddPin(pCVar18,&PinList);
      if (this->IsLUTup == 0) {
        pcVar15 = fgets(cLine,0x200,local_6a0);
        if (cLine[0] != '!' && pcVar15 != (char *)0x0) {
          do {
            if ((cLine[0] != '#') && (sVar16 = strlen(cLine), 1 < sVar16)) {
              strtok(cLine," \t\n");
              strtok((char *)0x0," \t\n");
              pcVar15 = strtok((char *)0x0," \t\n");
              iVar3 = atoi(pcVar15);
              if (0 < iVar3) {
                iVar13 = 0;
LAB_001067a1:
                do {
                  pcVar15 = fgets(cLine,0x200,local_6a0);
                  if (pcVar15 != (char *)0x0) {
                    if ((cLine[0] == '#') || (sVar16 = strlen(cLine), sVar16 < 2))
                    goto LAB_001067a1;
                  }
                  iVar6 = CNet::GetNumPin(pCVar18);
                  if (1 < iVar6) {
                    pCVar21 = CWire::New();
                    if (pCVar21 == (CWire *)0x0) {
                      __assert_fail("pWire",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                                    ,0x3a7,"virtual int CDesign::Initialize(char *)");
                    }
                    pcVar15 = strtok(cLine," \t\n");
                    iVar6 = atoi(pcVar15);
                    pcVar15 = strtok((char *)0x0," \t\n");
                    iVar7 = atoi(pcVar15);
                    strtok((char *)0x0," \t\n");
                    pcVar15 = strtok((char *)0x0," \t\n");
                    iVar25 = atoi(pcVar15);
                    pcVar15 = strtok((char *)0x0," \t\n");
                    iVar30 = atoi(pcVar15);
                    pCVar19 = CNet::GetPin(pCVar18,iVar6,iVar7);
                    pCVar22 = CNet::GetPin(pCVar18,iVar25,iVar30);
                    if (pCVar19 == (CPin *)0x0) {
                      iVar24 = this->m_iLowestRoutableLayer;
                    }
                    else {
                      iVar24 = (int)(pCVar19->super_CPoint).m_cZ;
                    }
                    if (pCVar22 == (CPin *)0x0) {
                      iZ = this->m_iLowestRoutableLayer;
                    }
                    else {
                      iZ = (int)(pCVar22->super_CPoint).m_cZ;
                    }
                    if (iZ < iVar24) {
                      if (pCVar19 == (CPin *)0x0) {
                        iZ = this->m_iLowestRoutableLayer;
                      }
                      else {
                        iZ = (int)(pCVar19->super_CPoint).m_cZ;
                      }
                    }
                    CWire::Initialize(pCVar21,iVar6,iVar7,iVar25,iVar30,iZ);
                    CNet::AddWire(pCVar18,pCVar21);
                  }
                  iVar13 = iVar13 + 1;
                } while (iVar13 != iVar3);
              }
            }
            pcVar15 = fgets(cLine,0x200,local_6a0);
          } while ((pcVar15 != (char *)0x0) && (cLine[0] != '!'));
        }
      }
      else {
        iVar3 = CNet::GetNumPin(pCVar18);
        if (iVar3 < 2) {
          if (local_6a0 != (FILE *)0x0) {
            fprintf(local_6a0,"%s %d %d\n!\n",cNetName,(ulong)(uint)(pCVar18->super_CObject).m_Key,0
                   );
          }
        }
        else {
          lVar32 = 0;
          for (lVar27 = 0; iVar3 = CNet::GetNumPin(pCVar18), lVar27 < iVar3; lVar27 = lVar27 + 1) {
            pCVar19 = CNet::GetPin(pCVar18,(int)lVar27);
            *(int *)((long)Initialize::iArrX + lVar32) = (int)(pCVar19->super_CPoint).m_iX;
            pCVar19 = CNet::GetPin(pCVar18,(int)lVar27);
            *(int *)((long)Initialize::iArrY + lVar32) = (int)(pCVar19->super_CPoint).m_iY;
            lVar32 = lVar32 + 4;
          }
          iVar3 = CNet::GetNumPin(pCVar18);
          if (iVar3 < 10) {
            iVar3 = CNet::GetNumPin(pCVar18);
            TVar34 = flute(iVar3,Initialize::iArrX,Initialize::iArrY,3);
          }
          else {
            iVar3 = CNet::GetNumPin(pCVar18);
            TVar34 = flute(iVar3,Initialize::iArrX,Initialize::iArrY,0x1c);
          }
          local_650 = TVar34.branch;
          iVar3 = TVar34.deg;
          uVar4 = iVar3 * 2 - 2;
          uVar28 = 0;
          if (1 < iVar3) {
            uVar20 = 1;
            if (1 < (int)uVar4) {
              uVar20 = (ulong)uVar4;
            }
            piVar26 = &local_650->n;
            uVar31 = 0;
            uVar28 = 0;
            do {
              uVar5 = *piVar26;
              if ((uVar31 != uVar5) &&
                 ((((Branch *)(piVar26 + -2))->x != local_650[(int)uVar5].x ||
                  (piVar26[-1] != local_650[(int)uVar5].y)))) {
                uVar28 = (ulong)((int)uVar28 + 1);
              }
              uVar31 = uVar31 + 1;
              piVar26 = piVar26 + 3;
            } while (uVar20 != uVar31);
          }
          if (local_6a0 != (FILE *)0x0) {
            fprintf(local_6a0,"%s %d %d\n",cNetName,(ulong)(uint)(pCVar18->super_CObject).m_Key,
                    uVar28);
          }
          if (1 < iVar3) {
            if ((int)uVar4 < 2) {
              uVar4 = 1;
            }
            uVar28 = 0;
            pBVar33 = local_650;
            do {
              uVar5 = pBVar33->n;
              if (uVar28 != uVar5) {
                pBVar1 = local_650 + (int)uVar5;
                if ((pBVar33->x != local_650[(int)uVar5].x) || (pBVar33->y != pBVar1->y)) {
                  if (local_6a0 != (FILE *)0x0) {
                    fprintf(local_6a0,"%d %d - %d %d\n",(ulong)(uint)pBVar33->x,
                            (ulong)(uint)pBVar33->y,(ulong)(uint)local_650[(int)uVar5].x,
                            (ulong)(uint)pBVar1->y);
                  }
                  pCVar21 = CWire::New();
                  if (pCVar21 == (CWire *)0x0) {
                    __assert_fail("pWire",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                                  ,0x37b,"virtual int CDesign::Initialize(char *)");
                  }
                  iVar3 = pBVar33->x;
                  iVar13 = pBVar33->y;
                  iVar6 = pBVar1->x;
                  iVar7 = pBVar1->y;
                  pCVar19 = CNet::GetPin(pCVar18,iVar3,iVar13);
                  pCVar22 = CNet::GetPin(pCVar18,iVar6,iVar7);
                  if (pCVar19 == (CPin *)0x0) {
                    iVar25 = this->m_iLowestRoutableLayer;
                  }
                  else {
                    iVar25 = (int)(pCVar19->super_CPoint).m_cZ;
                  }
                  if (pCVar22 == (CPin *)0x0) {
                    iVar30 = this->m_iLowestRoutableLayer;
                  }
                  else {
                    iVar30 = (int)(pCVar22->super_CPoint).m_cZ;
                  }
                  if (iVar30 < iVar25) {
                    if (pCVar19 == (CPin *)0x0) {
                      iVar30 = this->m_iLowestRoutableLayer;
                    }
                    else {
                      iVar30 = (int)(pCVar19->super_CPoint).m_cZ;
                    }
                  }
                  CWire::Initialize(pCVar21,iVar3,iVar13,iVar6,iVar7,iVar30);
                  CNet::AddWire(pCVar18,pCVar21);
                }
              }
              uVar28 = uVar28 + 1;
              pBVar33 = pBVar33 + 1;
            } while (uVar4 != uVar28);
          }
          if (local_6a0 != (FILE *)0x0) {
            fwrite("!\n",2,1,local_6a0);
          }
          fflush(local_6a0);
        }
      }
      iVar3 = CNet::IsLocal(pCVar18);
      lVar27 = local_640;
      if (iVar3 == 0) {
        iVar3 = CNet::GetNumWire(pCVar18,1,3);
        if (iVar3 == 0) {
          CObject::Display(1,"net %s should have at least one wire\n",cNetName);
        }
        iVar3 = CNet::GetLength(pCVar18,1,2);
        pCVar18->m_iMinWL = iVar3;
        local_68c = local_68c + 1;
      }
      else {
        if (pCVar18 != this->m_ppNet[local_640]) {
          __assert_fail("pNet==m_ppNet[iNetIndex]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                        ,0x3bd,"virtual int CDesign::Initialize(char *)");
        }
        (*(this->m_ppNet[local_640]->super_CObject)._vptr_CObject[1])();
        this->m_ppNet[lVar27] = (CNet *)0x0;
        this->m_iNumLocalNet = this->m_iNumLocalNet + 1;
      }
      iVar13 = local_654;
      if (PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar3 = iVar13 + 1;
    } while (iVar13 + 1 < this->m_iNumNet);
  }
  CreateNet(this,local_68c);
  pcVar15 = fgets(cLine,0x200,pFVar14);
  if (pcVar15 != (char *)0x0) {
    do {
      if ((cLine[0] != '#') && (sVar16 = strlen(cLine), 1 < sVar16)) {
        uVar4 = atoi(cLine);
        if (uVar4 != 0) {
          CObject::Display(0,"%d blocakges are specified\n",(ulong)uVar4);
          if ((int)uVar4 < 1) goto LAB_00106fc6;
          uVar5 = 0;
          goto LAB_00106d65;
        }
        break;
      }
      pcVar15 = fgets(cLine,0x200,pFVar14);
    } while (pcVar15 != (char *)0x0);
  }
  goto LAB_00106fe5;
LAB_00106032:
  pcVar15 = fgets(cLine,0x200,pFVar14);
  if (pcVar15 == (char *)0x0) goto LAB_00106336;
  goto LAB_00105d4a;
LAB_00106d65:
  do {
    do {
      pcVar15 = fgets(cLine,0x200,pFVar14);
      if (pcVar15 == (char *)0x0) break;
    } while ((cLine[0] == '#') || (sVar16 = strlen(cLine), sVar16 < 2));
    pcVar15 = strtok(cLine," \t\n");
    uVar8 = atoi(pcVar15);
    pcVar15 = strtok((char *)0x0," \t\n");
    uVar9 = atoi(pcVar15);
    pcVar15 = strtok((char *)0x0," \t\n");
    iLayer = atoi(pcVar15);
    uVar28 = (ulong)iLayer;
    pcVar15 = strtok((char *)0x0," \t\n");
    uVar10 = atoi(pcVar15);
    pcVar15 = strtok((char *)0x0," \t\n");
    uVar11 = atoi(pcVar15);
    pcVar15 = strtok((char *)0x0," \t\n");
    uVar12 = atoi(pcVar15);
    if (iLayer != uVar12) {
      __assert_fail("iZ1==iZ2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x3f0,"virtual int CDesign::Initialize(char *)");
    }
    iVar3 = uVar8 - uVar10;
    if (uVar9 - uVar11 != 0 && iVar3 != 0) {
      __assert_fail("iX1==iX2||iY1==iY2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x3f1,"virtual int CDesign::Initialize(char *)");
    }
    iVar13 = -iVar3;
    if (0 < iVar3) {
      iVar13 = iVar3;
    }
    if ((iVar13 != 1) && (((uVar9 - uVar11) + 1 & 0xfffffffd) != 0)) {
      __assert_fail("abs((iX1-iX2))==1||abs((iY1-iY2))==1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x3f2,"virtual int CDesign::Initialize(char *)");
    }
    pCVar23 = GetLayer(this,iLayer);
    if (uVar8 == uVar10 && uVar9 == uVar11) {
LAB_00106f08:
      CObject::Display(1,"boundary (%d,%d,%d)-(%d,%d,%d) not found\n",uVar8,uVar9,(ulong)iLayer,
                       (ulong)uVar10,(ulong)uVar11,uVar28);
      this_01 = (CBoundary *)0x0;
    }
    else {
      iVar3 = CLayer::IsHorizontal(pCVar23);
      uVar12 = uVar9;
      uVar29 = uVar8;
      if ((uVar9 - uVar11 == 0) && (iVar3 != 0)) {
        if (iVar13 != 1) {
          __assert_fail("abs(iX1-iX2)==1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                        ,0xaf,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
        }
        uVar29 = uVar10;
        if ((int)uVar8 < (int)uVar10) {
          uVar29 = uVar8;
        }
      }
      else {
        iVar3 = CLayer::IsVertical(pCVar23);
        if ((uVar8 != uVar10) || (iVar3 == 0)) goto LAB_00106f08;
        if (((uVar9 - uVar11) + 1 & 0xfffffffd) != 0) {
          __assert_fail("abs(iY1-iY2)==1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                        ,0xb4,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
        }
        uVar12 = uVar11;
        if ((int)uVar9 < (int)uVar11) {
          uVar12 = uVar9;
        }
      }
      this_01 = CLayer::GetBoundary(pCVar23,uVar29,uVar12);
      if (this_01 == (CBoundary *)0x0) goto LAB_00106f08;
    }
    if (*(short *)&(this_01->super_CPoint).field_0x26 != 0) {
      CObject::Display(1,"boundary (%d,%d,%d)-(%d,%d,%d) is overwritten\n",uVar8,uVar9,uVar28,
                       (ulong)uVar10,(ulong)uVar11,uVar28);
    }
    pCVar23 = CBoundary::GetParent(this_01);
    iVar3 = CLayer::GetCapacity(pCVar23,0x40);
    pcVar15 = strtok((char *)0x0," \t\n");
    iVar13 = atoi(pcVar15);
    this->m_iNumBCap = this->m_iNumBCap + (iVar3 - iVar13);
    CBoundary::AdjustCapacity(this_01,iVar3 - iVar13);
    uVar5 = uVar5 + 1;
  } while (uVar5 != uVar4);
LAB_00106fc6:
  uVar4 = GetCapacity(this,0x1000);
  CObject::Display(0,"total available capacity: %d\n",(ulong)uVar4);
LAB_00106fe5:
  if (pFVar14 != (FILE *)0x0) {
    fclose(pFVar14);
  }
  if (local_6a0 != (FILE *)0x0) {
    fclose(local_6a0);
  }
  uVar4 = this->m_iNumNet;
  iVar3 = GetMemory();
  CObject::Display(0,"input [%s with %d nets] is loaded (%.1f MB)\n",
                   SUB84((double)iVar3 * 0.0009765625,0),local_648,(ulong)uVar4);
  if ((this->field_0x834 != '\0') &&
     (pFVar14 = fopen(&this->field_0x834,"rt"), pFVar14 != (FILE *)0x0)) {
    fclose(pFVar14);
    this->field_0xc50 = this->field_0xc50 & 0xfc;
  }
  if (*(int *)&this->field_0xc54 < 0) {
    iVar13 = (int)(this->super_CBBox).m_iMaxX - (int)(this->super_CBBox).m_iMinX;
    iVar3 = (int)(this->super_CBBox).m_iMaxY - (int)(this->super_CBBox).m_iMinY;
    if (iVar3 < iVar13) {
      iVar3 = iVar13;
    }
    *(int *)&this->field_0xc54 = (int)((double)iVar3 * 0.1);
  }
  CObject::Display(2,"mazerouting margin %d\n");
  (*(this->super_CObject)._vptr_CObject[2])(this,stdout,0);
  return 1;
}

Assistant:

int	CDesign::Initialize(char* pName)
{
#ifdef _DEBUG
	m_iDebugNet	=	188;
#endif
	ReadParam(pName);

	//SetState(STATE_DESN_COMPLETED);
	//PrintResult();

	//vector<CGrid*>	Queue;

	//CGrid	G[4];
	//CGrid* pG[4];

	//G[0].SetMazeCostGrid(1,NULL);
	//G[1].SetMazeCostGrid(7,NULL);
	//G[2].SetMazeCostGrid(4,NULL);
	//G[3].SetMazeCostGrid(3,NULL);

	//Queue.push_back(&G[0]);

	//make_heap(Queue.begin(),Queue.end(),CGridOpMaze());

	//Queue.push_back(&G[1]);
	//Queue.push_back(&G[2]);
	//Queue.push_back(&G[3]);

	//push_heap(Queue.begin(), Queue.end(), CGridOpMaze());

	//pG[0]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[1]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[2]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[3]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();

	//G[1].SetMazeCostGrid(2,NULL);

	//push_heap(Queue.begin(), Queue.end(), CGridOpMaze());


	//pG[0]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[1]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[2]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[3]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();

	char	cName[MAX_BUFFER_STR];
	char	cLine[MAX_BUFFER_STR];

	//open log fiile
	SAFE_FCLOSE(m_pLog);
	sprintf(cName,"%s.log",m_Param.m_cInput_File);	
	m_pLog		=	fopen(cName,"wt");
	m_pDesign	=	this;

	Display(DISPLAY_MODE_INFO,"input file [%s]\n",m_Param.m_cInput_File);
	Display(DISPLAY_MODE_INFO,"tree file [%s]\n",m_Param.m_cTree_File);

	FILE*	pInput_File		=	fopen(m_Param.m_cInput_File,"rt");
	FILE*	pTree_File		=	fopen(m_Param.m_cTree_File,"rt");

	if(pTree_File==NULL)
	{
		Display(DISPLAY_MODE_INFO,"tree file will be written as ");

#ifdef WIN32

		// open in write mode [1/31/2007 thyeros]
		pTree_File		=	fopen(m_Param.m_cTree_File,"wt");
		readLUT();
#else
		
		char	cCmd[MAX_BUFFER_STR];

		//if(STRICMP(m_Param.m_cTree_File,"flute")==0 )
		//{
			// open in write mode [1/31/2007 thyeros]
		  	if(strlen(m_Param.m_cTree_File)==0)
			  {
			    sprintf(m_Param.m_cTree_File,"%s.stt",m_Param.m_cInput_File);
			  }

			Display(DISPLAY_MODE_NONE,"%s",m_Param.m_cTree_File);


			pTree_File		=	fopen(m_Param.m_cTree_File,"wt");
			readLUT(); // Before use flute you must init it. Need LUT Data files(provided by flute).

			Display(DISPLAY_MODE_INFO,"building steiner tree by *pure flute\n");
			//}

		/*
		else
		{

			if(strlen(m_Param.m_cTree_File)==0)
			{
				sprintf(m_Param.m_cTree_File,"%s.stt",m_Param.m_cInput_File);
			}

			Display(DISPLAY_MODE_NONE,"%s\n",m_Param.m_cTree_File);

			sprintf(cCmd,"./cflute.x -bt %s %s 1.0 > /tmp/stt",m_Param.m_cInput_File,m_Param.m_cTree_File);
			Display(DISPLAY_MODE_EXEC,"%s\n",cCmd);
			Display(DISPLAY_MODE_INFO,"building steiner tree in %s...",m_Param.m_cTree_File);
			Display(DISPLAY_MODE_NONE,"done (%d)!\n",system(cCmd));

			pTree_File		=	fopen(m_Param.m_cTree_File,"rt");
		}
		*/
#endif

	}else{
		IsLUTup=1;
	}

    // Read basic param of input data.
	while (fgets(cLine,sizeof(cLine),pInput_File))
	{
		if(cLine[0]=='#')	continue;
		if(strlen(cLine)<2)	continue;

		char*	pToken	=	strtok(cLine," \t\n");

		if(STRICMP(pToken,"grid")==0)
		{
			m_iSizeX		=	atoi(strtok(NULL," \t\n"));
			m_iSizeY		=	atoi(strtok(NULL," \t\n"));

			pToken			=	strtok(NULL," \t\n");
			if(pToken)	m_iSizeZ	=	max(2,atoi(pToken));		// multilayer routing [1/31/2007 thyeros]
			else		m_iSizeZ	=	2;							// planar routing [1/31/2007 thyeros]

            ///@sa CBBox::Initialize()
			CBBox::Initialize(0,0,0,m_iSizeX,m_iSizeY,m_iSizeZ);

            ///@sa CreateLayer()
			CreateLayer();
		}
		else if(STRICMP(pToken,"vertical")==0&&strtok(NULL," \t\n"))
		{
			int	iIndex	=	LAYER_METAL1;	
			for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"))
			{
				int	iCapacity	=	atoi(pToken);
				if(iCapacity)
				{
					for(;GetLayer(iIndex)->GetKey();iIndex++);	
                    ///@sa CLayer::Configure()
					GetLayer(iIndex)->Configure(iIndex,iCapacity,DIR_VERTICAL,0,0,0,this);
				}

				++iIndex;
			}
		}
		else if(STRICMP(pToken,"horizontal")==0&&strtok(NULL," \t\n"))
		{
			int	iIndex	=	LAYER_METAL1;	
			for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"))
			{
				int	iCapacity	=	atoi(pToken);
				if(iCapacity)
				{
					for(;GetLayer(iIndex)->GetKey();iIndex++);
					GetLayer(iIndex)->Configure(iIndex,iCapacity,DIR_HORIZONTAL,0,0,0,this);
				}

				++iIndex;
			}
		}
		else if(STRICMP(pToken,"minimum")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"width")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,atoi(pToken),-1,-1,this);
				}

			}
			else if(STRICMP(pToken,"spacing")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,-1,atoi(pToken),-1,this);
				}
			}
		}
		else if(STRICMP(pToken,"via")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"spacing")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,-1,-1,atoi(pToken),this);
				}
			}
		}
		else if(STRICMP(pToken,"num")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"net")==0)
			{
                ///@sa CreatNet()
				CreateNet(atoi(strtok(NULL," \t\n")));

				for (int i=LAYER_METAL1;i<=T();++i)	
				{
					CLayer*	pLayer	=	GetLayer(i);

					if(!pLayer->GetKey())
					{
						int	iDirection	=	-1;

						if(i==LAYER_METAL1)										iDirection	=	DIR_VERTICAL;
						else if(GetLayer(i-1)->GetDirection()==DIR_VERTICAL)	iDirection	=	DIR_HORIZONTAL;
						else													iDirection	=	DIR_VERTICAL;

						pLayer->Configure(i,0,iDirection,0,0,0,this);
					}

                    ///@sa CLayer::Initialize()
					pLayer->Initialize();
					m_iMaxCapacity		=	MAX(m_iMaxCapacity,pLayer->GetCapacity(GET_MODE_MAX));
				}

				///@sa SetHighestRoutableLayer()
				SetHighestRoutableLayer(T());
				///@sa SetLowestRoutableLayer()
				SetLowestRoutableLayer(LAYER_METAL1);

				break;
			}
		}
		else
		{
			m_iLowX		=	atoi(pToken);
			m_iLowY		=	atoi(strtok(NULL," \t\n"));
			m_iGridX	=	atoi(strtok(NULL," \t\n"));
			m_iGridY	=	atoi(strtok(NULL," \t\n"));
		}
	}

	Display(DISPLAY_MODE_INFO,"total available capacity: %d\n",GetCapacity(GET_MODE_ACAP));
	Display(DISPLAY_MODE_INFO,"reading nets started (%.1f MB)\n",GetMemory()/1024.0);

	//////////////////////////////////////////////////////////////////////////
	// start read nets [1/31/2007 thyeros]
	//////////////////////////////////////////////////////////////////////////
	int	iNetIndex	=	0;
	for(int i=0;i<m_iNumNet;++i)
	{
		while(fgets(cLine,sizeof(cLine),pInput_File))
		{
			if(cLine[0]=='#')	continue;
			if(strlen(cLine)<2)	continue;
			break;
		}

		char	cNetName[MAX_BUFFER_STR];
		sprintf(cNetName,strtok(cLine," \t\n"));
		int		iNetID	 		=	atoi(strtok(NULL," \t\n"));
		int		iNumPin			=	atoi(strtok(NULL," \t\n"));
		int		iWidth			=	1;

		char*	pToken			=	strtok(NULL," \t\n");
		if(pToken)	iWidth		=	atoi(pToken);	

		m_ppNet[iNetIndex]		=	new	CNet;
		assert(m_ppNet[iNetIndex]);

		CNet*	pNet			=	GetNet(iNetIndex);
        ///@sa CNet
		pNet->Initialize(iNetID,/*iWidth,*/this);

		if(iNumPin>1000)
		{
			Display(DISPLAY_MODE_WARN,"net (%s) with too many pins (%d) will be ignored\n",cNetName,iNumPin);

			for(int j=0;j<iNumPin;++j)
			{
				while(fgets(cLine,sizeof(cLine),pInput_File))
				{
					if(cLine[0]=='#')	continue;
					if(strlen(cLine)<2)	continue;
					break;
				}
			}

			iNumPin	=	0;
		}

		// get pins [1/31/2007 thyeros]
		vector<CPin*>	PinList;
		for(int j=0;j<iNumPin;++j)
		{
			while(fgets(cLine,sizeof(cLine),pInput_File))
			{
				if(cLine[0]=='#')	continue;
				if(strlen(cLine)<2)	continue;
				break;
			}

			// this is the real location [1/31/2007 thyeros]
			int	iRX				=	atoi(strtok(cLine," \t\n"));
			int	iRY				=	atoi(strtok(NULL," \t\n"));
			int	iX				=	(iRX-m_iLowX)/m_iGridX;
			int	iY				=	(iRY-m_iLowY)/m_iGridY;
			int	iZ				=	LAYER_METAL1;

			pToken				=	strtok(NULL," \t\n");
			if(pToken)	iZ		=	atoi(pToken);

			CPin*		pPin	=	NULL;

			for(int k=0;k<PinList.size()&&!pPin;k++)
			{
				CPin*	pCurPin	=	PinList[k];

				if(pCurPin->X()==iX&&pCurPin->Y()==iY)	pPin		=	pCurPin;
			}

			if(pPin==NULL)
			{
				pPin	=	new	CPin;
				pPin->Initialize(PinList.size(),iX,iY,iZ,pNet);
				PinList.push_back(pPin);
			}
		}

		pNet->AddPin(&PinList);
//		pNet->m_iMinVia	+=	PinList.size();

		if(IsLUTup)
		{
			if(pNet->GetNumPin()<2)
			{
				if(pTree_File) fprintf(pTree_File,"%s %d %d\n!\n",cNetName,(int)pNet->GetKey(),0);
			}
			else
			{
				// create and save a tree topolgy [1/31/2007 thyeros]
				static int iArrX[MAX_BUFFER];
				static int iArrY[MAX_BUFFER];

				for(int j=0;j<pNet->GetNumPin();++j)
				{
					iArrX[j]	=	pNet->GetPin(j)->X();
					iArrY[j]	=	pNet->GetPin(j)->Y();
				}			

				Tree FluteTree;

				if(pNet->GetNumPin()<=9)	FluteTree = flute(pNet->GetNumPin(),iArrX,iArrY,ACCURACY);
				else						FluteTree = flute(pNet->GetNumPin(),iArrX,iArrY,ACCURACY+25);

				int	iNumWire	=	0;
				for(int j=0;j<2*FluteTree.deg-2;++j) 
				{
					int     iNeighbor = FluteTree.branch[j].n;

					if(iNeighbor==j)        continue;
					if(FluteTree.branch[j].x==FluteTree.branch[iNeighbor].x&&FluteTree.branch[j].y==FluteTree.branch[iNeighbor].y)   continue;

					++iNumWire;
				}  

				if(pTree_File) fprintf(pTree_File,"%s %d %d\n",cNetName,(int)pNet->GetKey(),iNumWire);
				for(int j=0;j<2*FluteTree.deg-2;++j) 
				{
					int     iNeighbor = FluteTree.branch[j].n;

					if(iNeighbor==j)        continue;
					if(FluteTree.branch[j].x==FluteTree.branch[iNeighbor].x&&FluteTree.branch[j].y==FluteTree.branch[iNeighbor].y)   continue;

					if(pTree_File) fprintf(pTree_File,"%d %d - %d %d\n",  FluteTree.branch[j].x,FluteTree.branch[j].y,FluteTree.branch[iNeighbor].x,FluteTree.branch[iNeighbor].y);

					CWire*	pWire	=	CWire::New();//new	CWire;


					assert(pWire);

					int	iX1			=	FluteTree.branch[j].x;
					int	iY1			=	FluteTree.branch[j].y;
					int	iX2			=	FluteTree.branch[iNeighbor].x;
					int	iY2			=	FluteTree.branch[iNeighbor].y;

					CPin*	pPin1	=	pNet->GetPin(iX1,iY1);
					CPin*	pPin2	=	pNet->GetPin(iX2,iY2);
					int	iZ			=	MAX(pPin1? pPin1->Z():GetRoutableLayer(GET_MODE_MIN),pPin2? pPin2->Z():GetRoutableLayer(GET_MODE_MIN));

					pWire->Initialize(iX1,iY1,iX2,iY2,iZ);
					pNet->AddWire(pWire);
//					pNet->m_iMinVia	+=	(2-pWire->GetNumPinOn()+pWire->IsFlat()? 0:1);			
				}
				if(pTree_File) fprintf(pTree_File,"!\n");fflush(pTree_File);
			}
		}
		else
		{
			// read the tree toplogy [1/31/2007 thyeros]
			while(fgets(cLine,sizeof(cLine),pTree_File))
			{
				if(cLine[0]=='!')	break;
				if(cLine[0]=='#')	continue;
				if(strlen(cLine)<2)	continue;

				char*	pName			=	strtok(cLine," \t\n");
				int		iNetIndex 		=	atoi(strtok(NULL," \t\n"));
				int		iNumWire		=	atoi(strtok(NULL," \t\n"));

				for(int j=0;j<iNumWire;++j)
				{
					while(fgets(cLine,sizeof(cLine),pTree_File))
					{
						if(cLine[0]=='#')	continue;
						if(strlen(cLine)<2)	continue;
						break;
					}

					// larget nets with over 1000pins have ZERO pins [2/20/2007 thyeros]
					if(pNet->GetNumPin()>=2)
					{
						CWire*	pWire	=	CWire::New();//new	CWire;
						assert(pWire);

						int	iX1			=	atoi(strtok(cLine," \t\n"));
						int	iY1			=	atoi(strtok(NULL," \t\n"));
						strtok(NULL," \t\n");	//thyeros- dash.. [6/16/2006]
						int	iX2			=	atoi(strtok(NULL," \t\n"));
						int	iY2			=	atoi(strtok(NULL," \t\n"));

						CPin*	pPin1	=	pNet->GetPin(iX1,iY1);
						CPin*	pPin2	=	pNet->GetPin(iX2,iY2);
						int	iZ			=	MAX(pPin1? pPin1->Z():GetRoutableLayer(GET_MODE_MIN),pPin2? pPin2->Z():GetRoutableLayer(GET_MODE_MIN));

						pWire->Initialize(iX1,iY1,iX2,iY2,iZ);
						pNet->AddWire(pWire);
//						pNet->m_iMinVia	+=	(2-pWire->GetNumPinOn()+pWire->IsFlat()? 0:1);			
					}
				}				
			}
		}

		if(pNet->IsLocal())
		{
			assert(pNet==m_ppNet[iNetIndex]);

			SAFE_DEL(m_ppNet[iNetIndex]);
			++m_iNumLocalNet;
		}
		else
		{
			if(pNet->GetNumWire()==0)	Display(DISPLAY_MODE_ERRO,"net %s should have at least one wire\n",cNetName);
			pNet->m_iMinWL	=	pNet->GetLength(GET_MODE_STATE,STATE_WIRE_UNROUTED);
			++iNetIndex;
		}
	}

	// save some memory by removing local nets [2/13/2007 thyeros]
	CreateNet(iNetIndex);

	//////////////////////////////////////////////////////////////////////////
	// read speical net/blockages [1/31/2007 thyeros]
	//////////////////////////////////////////////////////////////////////////
	while(fgets(cLine,sizeof(cLine),pInput_File))
	{
		//// temporarily ignore blocakges  [2/27/2007 thyeros]
		//Display(DISPLAY_MODE_WARN,"blockages are ignored for test purpose!\n");
		//break;

		if(cLine[0]=='#')	continue;
		if(strlen(cLine)<2)	continue;

		int	iNumBlock	=	atoi(cLine);

		if(iNumBlock)
		{
			Display(DISPLAY_MODE_INFO,"%d blocakges are specified\n",iNumBlock);

			for(int i=0;i<iNumBlock;++i)
			{
				while(fgets(cLine,sizeof(cLine),pInput_File))
				{
					if(cLine[0]=='#')	continue;
					if(strlen(cLine)<2)	continue;
					break;
				}

				int	iX1		=	atoi(strtok(cLine," \t\n"));
				int	iY1		=	atoi(strtok(NULL," \t\n"));
				int	iZ1		=	atoi(strtok(NULL," \t\n"));

				int	iX2		=	atoi(strtok(NULL," \t\n"));
				int	iY2		=	atoi(strtok(NULL," \t\n"));
				int	iZ2		=	atoi(strtok(NULL," \t\n"));

				assert(iZ1==iZ2);
				assert(iX1==iX2||iY1==iY2);
				assert(abs((iX1-iX2))==1||abs((iY1-iY2))==1);

				CBoundary*	pBoundary	=	GetLayer(iZ1)->GetBoundary(iX1,iY1,iX2,iY2);

				if(!pBoundary)				Display(DISPLAY_MODE_ERRO,"boundary (%d,%d,%d)-(%d,%d,%d) not found\n",iX1,iY1,iZ1,iX2,iY2,iZ2);
				if(pBoundary->m_iNumOCap)	Display(DISPLAY_MODE_ERRO,"boundary (%d,%d,%d)-(%d,%d,%d) is overwritten\n",iX1,iY1,iZ1,iX2,iY2,iZ2);

				int	iBlockage	=	pBoundary->GetParent()->GetCapacity(GET_MODE_MAX)-atoi(strtok(NULL," \t\n"));
				m_iNumBCap	+=		iBlockage;
				pBoundary->AdjustCapacity(iBlockage);
			}
			Display(DISPLAY_MODE_INFO,"total available capacity: %d\n",GetCapacity(GET_MODE_ACAP));
		}

		break;
	}

	SAFE_FCLOSE(pInput_File);
	SAFE_FCLOSE(pTree_File);

	Display(DISPLAY_MODE_INFO,"input [%s with %d nets] is loaded (%.1f MB)\n",m_Param.m_cInput_File,GetNumNet(),GetMemory()/1024.0);

	if(strlen(m_Param.m_cDump_File))
	{
		FILE*	pDumpFile	=	fopen(m_Param.m_cDump_File,"rt");
		if(pDumpFile)
		{
			SAFE_FCLOSE(pDumpFile);
			m_Param.m_iProperty	&=	~(PROP_PARAM_PRER|PROP_PARAM_BOXR);
		}
	}

	if(m_Param.m_iMazeRouting_Margin<0)	m_Param.m_iMazeRouting_Margin	=	0.1*MAX(W(),H());
	Display(DISPLAY_MODE_PARM,"mazerouting margin %d\n",m_Param.m_iMazeRouting_Margin);

	Print(stdout,PRINT_MODE_TEXT);

	return	TRUE;
}